

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_Plugin_LegacyFeatures_Test::
TestBody(CommandLineInterfaceTest_Plugin_LegacyFeatures_Test *this)

{
  string_view contents;
  bool bVar1;
  char *pcVar2;
  FileDescriptorProto *pFVar3;
  DescriptorProto *pDVar4;
  FieldDescriptorProto *pFVar5;
  FieldOptions *pFVar6;
  char *in_R9;
  string_view src;
  string local_2f0;
  AssertHelper local_2d0;
  Message local_2c8;
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_288;
  Message local_280;
  bool local_271;
  undefined1 local_270 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_240;
  Message local_238;
  string_view local_230;
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar__1;
  CodeGeneratorRequest request;
  string local_190;
  AssertHelper local_170;
  Message local_168;
  undefined1 local_160 [16];
  bool local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_;
  string binary_request;
  undefined1 local_108 [8];
  string base64_output;
  AlphaNum local_b8;
  string local_88;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string plugin_path;
  char *local_28;
  string_view local_20;
  CommandLineInterfaceTest_Plugin_LegacyFeatures_Test *local_10;
  CommandLineInterfaceTest_Plugin_LegacyFeatures_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&plugin_path.field_2 + 8),
             "\n                      syntax = \"proto2\";\n                      package foo;\n                      message Foo {\n                        optional int32 b = 1;\n                      }"
            );
  contents._M_str = local_28;
  contents._M_len = plugin_path.field_2._8_8_;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,contents);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/fake_plugin"
             ,&local_51);
  std::allocator<char>::~allocator(&local_51);
  absl::lts_20250127::AlphaNum::AlphaNum
            (&local_b8,
             "protocol_compiler --fake_plugin_out=$tmpdir --proto_path=$tmpdir foo.proto --plugin=prefix-gen-fake_plugin="
            );
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
            ((AlphaNum *)((long)&base64_output.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_88,(lts_20250127 *)&local_b8,(AlphaNum *)((long)&base64_output.field_2 + 8),
             (AlphaNum *)plugin_path.field_2._8_8_);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&binary_request.field_2 + 8)
             ,"foo.proto.request");
  compiler::(anonymous_namespace)::CommandLineInterfaceTest::ReadFile_abi_cxx11_
            ((string *)local_108,this,stack0xfffffffffffffee8);
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  local_160 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_108);
  src._M_str = (char *)&gtest_ar_.message_;
  src._M_len = local_160._8_8_;
  local_149 = absl::lts_20250127::Base64Unescape
                        (local_160._0_8_,src,(Nonnull<std::string_*>)local_160._0_8_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_148,&local_149,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_190,(internal *)local_148,
               (AssertionResult *)"absl::Base64Unescape(base64_output, &binary_request)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x6b7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  if (bVar1) {
    CodeGeneratorRequest::CodeGeneratorRequest((CodeGeneratorRequest *)&gtest_ar__1.message_);
    local_230 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&gtest_ar_.message_);
    local_219 = protobuf::MessageLite::ParseFromString
                          ((MessageLite *)&gtest_ar__1.message_,local_230);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_218,&local_219,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
    if (!bVar1) {
      testing::Message::Message(&local_238);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_218,
                 (AssertionResult *)"request.ParseFromString(binary_request)","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_240,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x6b9,pcVar2);
      testing::internal::AssertHelper::operator=(&local_240,&local_238);
      testing::internal::AssertHelper::~AssertHelper(&local_240);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_238);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
    if (bVar1) {
      pFVar3 = CodeGeneratorRequest::proto_file((CodeGeneratorRequest *)&gtest_ar__1.message_,0);
      pDVar4 = FileDescriptorProto::message_type(pFVar3,0);
      pFVar5 = DescriptorProto::field(pDVar4,0);
      pFVar6 = FieldDescriptorProto::options(pFVar5);
      bVar1 = FieldOptions::has_features(pFVar6);
      local_271 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_270,&local_271,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
      if (!bVar1) {
        testing::Message::Message(&local_280);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_270,
                   (AssertionResult *)
                   "request.proto_file(0).message_type(0).field(0).options().has_features()","true",
                   "false",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_288,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                   ,0x6bc,pcVar2);
        testing::internal::AssertHelper::operator=(&local_288,&local_280);
        testing::internal::AssertHelper::~AssertHelper(&local_288);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_280);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
      pFVar3 = CodeGeneratorRequest::source_file_descriptors
                         ((CodeGeneratorRequest *)&gtest_ar__1.message_,0);
      pDVar4 = FileDescriptorProto::message_type(pFVar3,0);
      pFVar5 = DescriptorProto::field(pDVar4,0);
      pFVar6 = FieldDescriptorProto::options(pFVar5);
      bVar1 = FieldOptions::has_features(pFVar6);
      local_2b9 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
      if (!bVar1) {
        testing::Message::Message(&local_2c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_2f0,(internal *)local_2b8,
                   (AssertionResult *)
                   "request.source_file_descriptors(0) .message_type(0) .field(0) .options() .has_features()"
                   ,"true","false",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_2d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                   ,0x6c1,pcVar2);
        testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
        testing::internal::AssertHelper::~AssertHelper(&local_2d0);
        std::__cxx11::string::~string((string *)&local_2f0);
        testing::Message::~Message(&local_2c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
    }
    CodeGeneratorRequest::~CodeGeneratorRequest((CodeGeneratorRequest *)&gtest_ar__1.message_);
  }
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, Plugin_LegacyFeatures) {
  CreateTempFile("foo.proto",
                 R"schema(
                      syntax = "proto2";
                      package foo;
                      message Foo {
                        optional int32 b = 1;
                      })schema");

#ifdef GOOGLE_PROTOBUF_FAKE_PLUGIN_PATH
  std::string plugin_path = GOOGLE_PROTOBUF_FAKE_PLUGIN_PATH;
#else
  std::string plugin_path = absl::StrCat(
      TestUtil::TestSourceDir(), "/google/protobuf/compiler/fake_plugin");
#endif

  // Invoke protoc with fake_plugin to get ahold of the CodeGeneratorRequest
  // sent by protoc.
  Run(absl::StrCat(
      "protocol_compiler --fake_plugin_out=$tmpdir --proto_path=$tmpdir "
      "foo.proto --plugin=prefix-gen-fake_plugin=",
      plugin_path));
  ExpectNoErrors();
  std::string base64_output = ReadFile("foo.proto.request");
  std::string binary_request;
  ASSERT_TRUE(absl::Base64Unescape(base64_output, &binary_request));
  CodeGeneratorRequest request;
  ASSERT_TRUE(request.ParseFromString(binary_request));

  EXPECT_FALSE(
      request.proto_file(0).message_type(0).field(0).options().has_features());
  EXPECT_FALSE(request.source_file_descriptors(0)
                   .message_type(0)
                   .field(0)
                   .options()
                   .has_features());
}